

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v9::detail::snprintf_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  buffer<char> *this;
  type tVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  ulong __maxlen;
  undefined1 *puVar5;
  int local_70;
  undefined1 local_69;
  type size;
  int result;
  _func_int_char_ptr_size_t_char_ptr_varargs *snprintf_ptr;
  size_t capacity;
  char *begin;
  size_t offset;
  char *format_ptr;
  buffer<char> *pbStack_28;
  char format [7];
  buffer<char> *buf_local;
  int precision_local;
  double value_local;
  float_specs specs_local;
  
  pbStack_28 = buf;
  sVar2 = buffer<char>::capacity(buf);
  sVar3 = buffer<char>::size(pbStack_28);
  if (sVar2 <= sVar3) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/_deps/fmt-src/include/fmt/format.h"
                ,0x62e,"empty buffer");
  }
  value_local._4_4_ = specs._4_4_;
  if (specs._4_1_ == '\x03') {
    offset = (long)&format_ptr + 2;
    format_ptr._1_1_ = 0x25;
    if ((value_local._4_4_ >> 0x13 & 1) != 0) {
      offset = (long)&format_ptr + 3;
      format_ptr._2_1_ = 0x23;
    }
    if (-1 < precision) {
      puVar5 = (undefined1 *)(offset + 1);
      *(undefined1 *)offset = 0x2e;
      offset = offset + 2;
      *puVar5 = 0x2a;
    }
    local_69 = 0x41;
    if (((ulong)specs & 0x1000000000000) == 0) {
      local_69 = 0x61;
    }
    *(undefined1 *)offset = local_69;
    *(undefined1 *)(offset + 1) = 0;
    sVar2 = buffer<char>::size(pbStack_28);
    while( true ) {
      while( true ) {
        pcVar4 = buffer<char>::data(pbStack_28);
        sVar3 = buffer<char>::capacity(pbStack_28);
        __maxlen = sVar3 - sVar2;
        abort_fuzzing_if(100000 < precision);
        if (precision < 0) {
          local_70 = snprintf(pcVar4 + sVar2,__maxlen,(char *)((long)&format_ptr + 1),value,snprintf
                             );
        }
        else {
          local_70 = snprintf(pcVar4 + sVar2,__maxlen,(char *)((long)&format_ptr + 1),value,
                              (ulong)(uint)precision,snprintf);
        }
        this = pbStack_28;
        if (-1 < local_70) break;
        sVar3 = buffer<char>::capacity(pbStack_28);
        buffer<char>::try_reserve(this,sVar3 + 1);
      }
      tVar1 = to_unsigned<int>(local_70);
      if (tVar1 < __maxlen) break;
      buffer<char>::try_reserve(pbStack_28,tVar1 + sVar2 + 1);
    }
    buffer<char>::try_resize(pbStack_28,tVar1 + sVar2);
    return 0;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/_deps/fmt-src/include/fmt/format.h"
              ,0x62f,"");
}

Assistant:

auto snprintf_float(T value, int precision, float_specs specs,
                    buffer<char>& buf) -> int {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  FMT_ASSERT(specs.format == float_format::hex, "");
  static_assert(!std::is_same<T, float>::value, "");

  // Build the format string.
  char format[7];  // The longest format is "%#.*Le".
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.upper ? 'A' : 'a';
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
    abort_fuzzing_if(precision > 100000);
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size < capacity) {
      buf.try_resize(size + offset);
      return 0;
    }
    buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
  }
}